

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

MixMaterial *
pbrt::MixMaterial::Create
          (MaterialHandle *materials,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  MixMaterial *pMVar2;
  initializer_list<pbrt::FloatTextureHandle> ftex;
  allocator<char> local_59;
  FloatTextureHandle amount;
  MaterialHandle *materials_local;
  Allocator alloc_local;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_40 [4];
  
  materials_local = materials;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"amount",&local_59);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&amount,(string *)parameters,0.5,
             (memory_resource *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  if (*(char *)(Options + 8) == '\x01') {
    local_40[0] = amount.
                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                  .bits;
    ftex._M_len = 1;
    ftex._M_array = (iterator)local_40;
    bVar1 = BasicTextureEvaluator::CanEvaluate
                      ((BasicTextureEvaluator *)&local_59,ftex,
                       (initializer_list<pbrt::SpectrumTextureHandle>)ZEXT816(0));
    if (!bVar1) {
      ErrorExit(loc,
                "The GPU renderer currently only supports basic textures for its \"amount\" parameter."
               );
    }
  }
  pMVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MixMaterial,pbrt::MaterialHandle*&,pbrt::FloatTextureHandle&>
                     (&alloc_local,&materials_local,&amount);
  return pMVar2;
}

Assistant:

MixMaterial *MixMaterial::Create(MaterialHandle materials[2],
                                 const TextureParameterDictionary &parameters,
                                 const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle amount = parameters.GetFloatTexture("amount", 0.5f, alloc);

    if (Options->useGPU) {
        // Check for this stuff here, where we can include the FileLoc in
        // the error message. Note that both of these limitations could be
        // relaxed if they were problematic; the issue is that we currently
        // resolve MixMaterials in the closest hit shader...
        if (!BasicTextureEvaluator().CanEvaluate({amount}, {}))
            ErrorExit(loc, "The GPU renderer currently only supports basic textures "
                           "for its \"amount\" parameter.");
    }

    return alloc.new_object<MixMaterial>(materials, amount);
}